

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionDetector.hpp
# Opt level: O1

void __thiscall
RegionDetector::
RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
::processStack(RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
               *this,uint newPixelGreyLevel,
              vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
              *regionStack,RegionAllocator<RegionDetector::Region> *regionAllocator)

{
  pointer *pppRVar1;
  pointer ppRVar2;
  Region *other;
  Region *pRVar3;
  iterator __position;
  Region *local_30;
  
  ppRVar2 = (regionStack->
            super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  other = ppRVar2[-1];
  (regionStack->
  super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = ppRVar2 + -1;
  while( true ) {
    ppRVar2 = (regionStack->
              super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if ((regionStack->
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>).
        _M_impl.super__Vector_impl_data._M_start == ppRVar2) {
      __assert_fail("!regionStack.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/./RegionDetector/RegionDetector.hpp"
                    ,0x35,
                    "void RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::processStack(unsigned int, std::vector<REGION_TYPE *> &, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                   );
    }
    pRVar3 = ppRVar2[-1];
    if (newPixelGreyLevel < pRVar3->level) break;
    Region::merge(pRVar3,other);
    if (newPixelGreyLevel <=
        (regionStack->
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>).
        _M_impl.super__Vector_impl_data._M_finish[-1]->level) {
      return;
    }
  }
  local_30 = RegionAllocator<RegionDetector::Region>::new_(regionAllocator,newPixelGreyLevel);
  __position._M_current =
       (regionStack->
       super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (regionStack->
      super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>>::
    _M_realloc_insert<RegionDetector::Region*>
              ((vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>> *)
               regionStack,__position,&local_30);
  }
  else {
    *__position._M_current = local_30;
    pppRVar1 = &(regionStack->
                super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    *pppRVar1 = *pppRVar1 + 1;
  }
  pRVar3 = (regionStack->
           super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>).
           _M_impl.super__Vector_impl_data._M_finish[-1];
  if (pRVar3 != (Region *)0x0) {
    Region::merge(pRVar3,other);
    return;
  }
  __assert_fail("regionStack.back()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/./RegionDetector/RegionDetector.hpp"
                ,0x39,
                "void RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::processStack(unsigned int, std::vector<REGION_TYPE *> &, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
               );
}

Assistant:

void processStack(unsigned int newPixelGreyLevel, std::vector<REGION_TYPE*> &regionStack, REGION_ALLOCATOR_TYPE *regionAllocator) {

			Region *first = regionStack.back();
			regionStack.pop_back();

			do {
				assert(!regionStack.empty());
				if (newPixelGreyLevel < regionStack.back()->level) {

					regionStack.push_back(regionAllocator->new_(newPixelGreyLevel));
					assert(regionStack.back());
					regionStack.back()->merge(first);

					return;
				}

				assert(!regionStack.empty());
				regionStack.back()->merge(first);

			} while (newPixelGreyLevel > regionStack.back()->level);
		}